

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  expkind eVar1;
  ravi_type_map rVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  TString *pTVar6;
  uint uVar7;
  int iVar8;
  TString *pTVar9;
  LexState *ls;
  OpCode o;
  char *pcVar10;
  OpCode OVar11;
  char var_type_map_str [80];
  char acStack_c8 [80];
  char local_78 [80];
  
  eVar1 = var->k;
  if (eVar1 == VINDEXED) {
    iVar4 = luaK_exp2RK(fs,ex);
    OVar11 = OP_SETTABUP;
    if ((var->u).ind.vt == '\b') {
      rVar2 = (var->u).ind.key_ravi_type_map;
      OVar11 = OP_SETTABLE;
      if (rVar2 == 0x100) {
        iVar8 = isshortstr(fs,(int)(var->u).ind.idx);
        if ((iVar8 != 0) && (OVar11 = OP_RAVI_SETFIELD, var->ravi_type_map == 0x80)) {
          OVar11 = OP_RAVI_TABLE_SETFIELD;
        }
      }
      else if (rVar2 == 8) {
        if (var->ravi_type_map == 0x20) {
          OVar11 = (uint)(ex->ravi_type_map == 8) * 2 + OP_RAVI_IARRAY_SET;
        }
        else {
          OVar11 = OP_RAVI_SETI;
          if (var->ravi_type_map == 0x40) {
            OVar11 = (uint)(ex->ravi_type_map == 0x10) * 2 + OP_RAVI_FARRAY_SET;
          }
        }
      }
    }
    uVar5 = (uint)(var->u).ind.t;
    iVar8 = (int)(var->u).ind.idx;
    goto LAB_00146e03;
  }
  if (eVar1 == VUPVAL) {
    uVar5 = luaK_exp2anyreg(fs,ex);
    uVar3 = var->ravi_type_map;
    OVar11 = OP_SETUPVAL;
    if ((int)uVar3 < 0x80) {
      if ((uVar3 - 8 < 0x39) && ((0x100000001000101U >> ((ulong)(uVar3 - 8) & 0x3f) & 1) != 0))
      goto LAB_00146b57;
    }
    else if ((int)uVar3 < 0x201) {
      if ((uVar3 == 0x80) || (uVar3 == 0x101)) {
LAB_00146b57:
        if ((~uVar3 & ex->ravi_type_map) != 0) {
          if ((int)uVar3 < 0x80) {
            if ((int)uVar3 < 0x20) {
              OVar11 = OP_RAVI_SETUPVALI;
              if (uVar3 != 8) {
                if (uVar3 != 0x10) {
LAB_00146f41:
                  raviY_typemap_string(uVar3,local_78);
                  raviY_typemap_string(ex->ravi_type_map,acStack_c8);
                  ls = fs->ls;
                  pcVar10 = luaO_pushfstring(ls->L,
                                             "Invalid assignment of upvalue: upvalue type %s, expression type %s"
                                             ,local_78,acStack_c8);
                  goto LAB_00147000;
                }
                OVar11 = OP_RAVI_SETUPVALF;
              }
            }
            else if (uVar3 == 0x20) {
              OVar11 = OP_RAVI_SETUPVAL_IARRAY;
            }
            else {
              if (uVar3 != 0x40) goto LAB_00146f41;
              OVar11 = OP_RAVI_SETUPVAL_FARRAY;
            }
          }
          else if ((int)uVar3 < 0x201) {
            if (uVar3 == 0x80) {
              OVar11 = OP_RAVI_SETUPVALT;
            }
            else {
              if (uVar3 != 0x101) goto LAB_00146f41;
              o = OP_RAVI_TOSTRING;
LAB_00146dc4:
              luaK_codeABC(fs,o,uVar5,0,0);
            }
          }
          else {
            if (uVar3 == 0x201) {
              o = OP_RAVI_TOCLOSURE;
              goto LAB_00146dc4;
            }
            if (uVar3 != 0x401) goto LAB_00146f41;
            uVar3 = luaK_stringK(fs,fs->f->upvalues[(var->u).info].usertype);
            luaK_codeABx(fs,OP_RAVI_TOTYPE,uVar5,uVar3);
          }
        }
      }
    }
    else if ((uVar3 == 0x401) || (uVar3 == 0x201)) goto LAB_00146b57;
    iVar8 = (var->u).info;
    iVar4 = 0;
LAB_00146e03:
    luaK_codeABC(fs,OVar11,uVar5,iVar8,iVar4);
    if (ex->k != VNONRELOC) {
      return;
    }
    freereg(fs,(ex->u).info);
    return;
  }
  if (eVar1 != VLOCAL) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x429,"void luaK_storevar(FuncState *, expdesc *, expdesc *)");
  }
  uVar5 = var->ravi_type_map;
  if (ex->k == VNONRELOC) {
    if ((int)uVar5 < 0x80) {
      if ((uVar5 - 8 < 0x39) && ((0x100000001000101U >> ((ulong)(uVar5 - 8) & 0x3f) & 1) != 0))
      goto LAB_00146e6f;
      goto LAB_00146c99;
    }
    if ((int)uVar5 < 0x201) {
      if ((uVar5 != 0x80) && (uVar5 != 0x101)) goto LAB_00146c99;
    }
    else if ((uVar5 != 0x201) && (uVar5 != 0x401)) goto LAB_00146c99;
  }
  else {
LAB_00146c99:
    uVar3 = ex->ravi_type_map;
    uVar7 = 8;
    if (uVar3 != 0x20) {
      uVar7 = -(uint)(uVar3 != 0x40) | 0x10;
    }
    if (ex->k != VINDEXED) {
      uVar7 = uVar3;
    }
    if (uVar5 == 8) {
      if (uVar7 != 8) {
        if (uVar7 != 0xffffffff) {
          ls = fs->ls;
          pcVar10 = "Invalid assignment: integer expected";
          goto LAB_00146f31;
        }
        iVar4 = luaK_exp2RK(fs,ex);
        OVar11 = OP_RAVI_TOINT;
        goto LAB_00146e5d;
      }
    }
    else if (uVar5 == 0x10) {
      if (uVar7 != 0x10) {
        if (uVar7 != 0xffffffff) {
          ls = fs->ls;
          pcVar10 = "Invalid assignment: number expected";
          goto LAB_00146f31;
        }
        iVar4 = luaK_exp2RK(fs,ex);
        OVar11 = OP_RAVI_TOFLT;
        goto LAB_00146e5d;
      }
    }
    else {
      if ((uVar5 & 0xffffff1f) == 0) {
        if (uVar7 == uVar5) goto LAB_00146e69;
        if (uVar7 == 0xffffffff) {
          OVar11 = OP_RAVI_TOIARRAY;
          if ((uVar5 & 0x20) == 0) {
            OVar11 = ((uVar5 & 0x40) == 0) + OP_RAVI_TOFARRAY;
          }
          iVar4 = luaK_exp2RK(fs,ex);
          goto LAB_00146e5d;
        }
        ls = fs->ls;
        pcVar10 = "@integer[]";
        if (uVar5 == 0x40) {
          pcVar10 = "@number[]";
        }
        pTVar9 = (TString *)0x15e45b;
        if (uVar5 != 0x80) {
          pTVar9 = (TString *)(pcVar10 + 1);
        }
        pcVar10 = "Invalid assignment: %s expected";
LAB_00146ff5:
        pcVar10 = luaO_pushfstring(ls->L,pcVar10,pTVar9);
LAB_00147000:
        luaX_syntaxerror(ls,pcVar10);
      }
      if (uVar5 == 0x401) {
        if ((uVar7 & 0xfffffbfe) == 0) {
          if (0x3ff < uVar7) {
            pTVar6 = var->usertype;
            if (pTVar6 == (TString *)0x0) {
              pTVar6 = (TString *)0x0;
            }
            else if (pTVar6 == ex->usertype) goto LAB_00146e69;
LAB_00146fd8:
            ls = fs->ls;
            pcVar10 = "Invalid assignment: usertype %s expected";
            pTVar9 = (TString *)"UNKNOWN";
            if (pTVar6 != (TString *)0x0) {
              pTVar9 = pTVar6 + 1;
            }
            goto LAB_00146ff5;
          }
        }
        else {
          if (uVar7 != 0xffffffff) {
            pTVar6 = var->usertype;
            goto LAB_00146fd8;
          }
          iVar4 = luaK_exp2RK(fs,ex);
          uVar5 = luaK_stringK(fs,var->usertype);
          luaK_codeABx(fs,OP_RAVI_TOTYPE,iVar4,uVar5);
        }
      }
      else if (uVar5 == 0x201) {
        if ((uVar7 & 0xfffffdfe) != 0) {
          if (uVar7 != 0xffffffff) {
            ls = fs->ls;
            pcVar10 = "Invalid assignment: function expected";
            goto LAB_00146f31;
          }
          iVar4 = luaK_exp2RK(fs,ex);
          OVar11 = OP_RAVI_TOCLOSURE;
          goto LAB_00146e5d;
        }
      }
      else if ((uVar5 == 0x101) && ((uVar7 & 0xfffffefe) != 0)) {
        if (uVar7 != 0xffffffff) {
          ls = fs->ls;
          pcVar10 = "Invalid assignment: string expected";
LAB_00146f31:
          pcVar10 = luaO_pushfstring(ls->L,pcVar10);
          goto LAB_00147000;
        }
        iVar4 = luaK_exp2RK(fs,ex);
        OVar11 = OP_RAVI_TOSTRING;
LAB_00146e5d:
        luaK_codeABC(fs,OVar11,iVar4,0,0);
      }
    }
LAB_00146e69:
    if (ex->k != VNONRELOC) goto LAB_00146e7b;
  }
LAB_00146e6f:
  freereg(fs,(ex->u).info);
LAB_00146e7b:
  exp2reg(fs,ex,(var->u).info);
  return;
}

Assistant:

void luaK_storevar (FuncState *fs, expdesc *var, expdesc *ex) {
  switch (var->k) {
    case VLOCAL: {
      check_valid_store(fs, var, ex);
      freeexp(fs, ex);
      exp2reg(fs, ex, var->u.info);  /* compute 'ex' into proper place */
      return;
    }
    case VUPVAL: {
      int e = luaK_exp2anyreg(fs, ex);
      OpCode op = check_valid_setupval(fs, var, ex, e);
      luaK_codeABC(fs, op, e, var->u.info, 0);
      break;
    }
    case VINDEXED: {
      OpCode op;
      int e = luaK_exp2RK(fs, ex);
      if (var->u.ind.vt == VLOCAL) {
        /* table value set - if array access then use specialized versions */
        if (var->u.ind.key_ravi_type_map == RAVI_TM_INTEGER) {
          if (var->ravi_type_map == RAVI_TM_FLOAT_ARRAY) {
                op = ex->ravi_type_map == RAVI_TM_FLOAT ? OP_RAVI_FARRAY_SETF : OP_RAVI_FARRAY_SET;
          } else if (var->ravi_type_map == RAVI_TM_INTEGER_ARRAY) {
                op = ex->ravi_type_map == RAVI_TM_INTEGER ? OP_RAVI_IARRAY_SETI : OP_RAVI_IARRAY_SET;
          } else {
            op = OP_RAVI_SETI;
          }
        } else if (var->u.ind.key_ravi_type_map == RAVI_TM_STRING && isshortstr(fs, var->u.ind.idx)) {
          op = var->ravi_type_map == RAVI_TM_TABLE ? OP_RAVI_TABLE_SETFIELD : OP_RAVI_SETFIELD;
        } else {
          op = OP_SETTABLE;
        }
      } else {
        op = OP_SETTABUP;
      }
      luaK_codeABC(fs, op, var->u.ind.t, var->u.ind.idx, e);
      break;
    }
    default: lua_assert(0);  /* invalid var kind to store */
  }
  freeexp(fs, ex);
}